

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O1

bool cmPolicies::ApplyPolicyVersion(cmMakefile *mf,uint majorVer,uint minorVer,uint patchVer)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *__s;
  string *psVar5;
  ostream *poVar6;
  cmState *this;
  PolicyID id;
  uint uVar7;
  uint uVar8;
  undefined1 uVar9;
  PolicyStatus status;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  string defaultVar;
  ostringstream e;
  allocator<char> local_211;
  cmMakefile *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  bVar13 = majorVer == 3;
  uVar8 = minorVer + 1;
  uVar7 = patchVer + 1;
  bVar14 = patchVer == 0xffffffff;
  bVar10 = 8 < uVar8;
  bVar15 = minorVer == 8;
  bVar11 = majorVer < 2;
  bVar16 = majorVer == 2;
  bVar12 = uVar8 < 7;
  bVar17 = minorVer == 6;
  bVar19 = false;
  id = CMP0000;
  local_210 = mf;
  do {
    uVar9 = uVar7 < 4;
    bVar2 = bVar15;
    switch(id) {
    case CMP0000:
    case CMP0001:
    case CMP0002:
    case CMP0003:
    case CMP0004:
    case CMP0005:
    case CMP0006:
    case CMP0007:
      uVar9 = (bVar17 && bVar14) && bVar16;
      if (bVar12 && bVar16 || bVar11) break;
      goto LAB_00196cad;
    case CMP0008:
      uVar9 = uVar7 < 2;
      bVar2 = bVar17;
      if (bVar12 && bVar16 || bVar11) break;
joined_r0x00196ca7:
      if (bVar2 && bVar16) goto LAB_00196cad;
      goto switchD_00196ae7_default;
    case CMP0009:
      uVar9 = uVar7 < 3;
      bVar2 = bVar17;
      if ((!bVar12 || !bVar16) && !bVar11) goto joined_r0x00196ca7;
      break;
    case CMP0010:
    case CMP0011:
      bVar2 = bVar17;
      if ((!bVar12 || !bVar16) && !bVar11) goto joined_r0x00196ca7;
      break;
    case CMP0012:
    case CMP0013:
    case CMP0014:
      uVar9 = (bVar15 && bVar14) && bVar16;
      if ((bVar10 || !bVar16) && !bVar11) goto LAB_00196cad;
      break;
    case CMP0015:
      uVar9 = uVar7 < 2;
      if ((bVar10 || !bVar16) && !bVar11) goto joined_r0x00196ca7;
      break;
    case CMP0016:
      if ((bVar10 || !bVar16) && !bVar11) goto joined_r0x00196ca7;
      break;
    case CMP0017:
      uVar9 = uVar7 < 5;
      if ((bVar10 || !bVar16) && !bVar11) goto joined_r0x00196ca7;
      break;
    case CMP0018:
      uVar9 = uVar7 < 10;
      if ((bVar10 || !bVar16) && !bVar11) goto joined_r0x00196ca7;
      break;
    case CMP0019:
    case CMP0020:
      uVar9 = uVar7 < 0xc;
      if ((bVar10 || !bVar16) && !bVar11) goto joined_r0x00196ca7;
      break;
    case CMP0021:
    case CMP0022:
    case CMP0023:
      uVar9 = uVar7 < 0xd;
      if ((bVar10 || !bVar16) && !bVar11) goto joined_r0x00196ca7;
      break;
    case CMP0024:
    case CMP0025:
    case CMP0026:
    case CMP0027:
    case CMP0028:
    case CMP0029:
    case CMP0030:
    case CMP0031:
    case CMP0032:
    case CMP0033:
    case CMP0034:
    case CMP0035:
    case CMP0036:
    case CMP0037:
    case CMP0038:
    case CMP0039:
    case CMP0040:
    case CMP0041:
    case CMP0042:
    case CMP0043:
    case CMP0044:
    case CMP0045:
    case CMP0046:
    case CMP0047:
    case CMP0048:
    case CMP0049:
    case CMP0050:
      bVar2 = minorVer != 0xffffffff || !bVar13;
      bVar18 = minorVer == 0;
      goto joined_r0x00196c27;
    case CMP0051:
    case CMP0052:
    case CMP0053:
    case CMP0054:
      bVar2 = 1 < uVar8 || !bVar13;
      bVar18 = minorVer == 1;
      goto joined_r0x00196c27;
    case CMP0055:
    case CMP0056:
      bVar2 = 2 < uVar8 || !bVar13;
      bVar18 = minorVer == 2;
joined_r0x00196c27:
      uVar9 = bVar18 && bVar14;
      uVar1 = !bVar2;
      goto joined_r0x00196bc3;
    case CMP0057:
    case CMP0058:
    case CMP0059:
    case CMP0060:
    case CMP0061:
    case CMP0062:
    case CMP0063:
      bVar2 = 3 < uVar8 || !bVar13;
      bVar18 = minorVer == 3;
      goto joined_r0x00196bd7;
    case CMP0064:
    case CMP0065:
      bVar2 = 4 < uVar8 || !bVar13;
      bVar18 = minorVer == 4;
joined_r0x00196bd7:
      uVar9 = bVar18 && bVar14;
      goto joined_r0x00196c55;
    case CMP0066:
      bVar2 = 7 < uVar8 || !bVar13;
      uVar9 = minorVer == 7 && bVar14;
      goto joined_r0x00196c55;
    case CMP0067:
      bVar2 = !bVar13 || bVar10;
      uVar9 = bVar15 && bVar14;
joined_r0x00196c55:
      uVar1 = !bVar2;
      goto joined_r0x00196bc3;
    case CMP0068:
    case CMP0069:
      bVar2 = 9 < uVar8 || !bVar13;
      bVar18 = minorVer == 9;
      goto joined_r0x00196b87;
    case CMP0070:
    case CMP0071:
      bVar2 = 10 < uVar8 || !bVar13;
      bVar18 = minorVer == 10;
      goto joined_r0x00196b87;
    case CMP0072:
      bVar2 = 0xb < uVar8 || !bVar13;
      bVar18 = minorVer == 0xb;
      goto joined_r0x00196b87;
    case CMP0073:
    case CMP0074:
    case CMP0075:
      bVar2 = 0xc < uVar8 || !bVar13;
      bVar18 = minorVer == 0xc;
joined_r0x00196b87:
      uVar1 = !bVar2;
      uVar9 = bVar18 && bVar14;
joined_r0x00196bc3:
      uVar9 = (bool)uVar9 && bVar13;
      if ((bool)uVar1 || majorVer < 3) break;
LAB_00196cad:
      if ((bool)uVar9) break;
switchD_00196ae7_default:
      bVar2 = cmMakefile::SetPolicy(local_210,id,NEW);
      if (!bVar2) {
        return bVar19;
      }
      goto LAB_00196f78;
    case CMP0076:
    case CMP0077:
      goto LAB_00196c0e;
    case CMP0078:
    case CMP0079:
    case CMP0080:
    case CMP0081:
LAB_00196c0e:
      uVar9 = patchVer == 0xffffffff && minorVer == 0xd;
      uVar1 = uVar8 < 0xe && bVar13;
      goto joined_r0x00196bc3;
    case CMP0082:
    case CMP0083:
    case CMP0084:
    case CMP0085:
    case CMP0086:
    case CMP0087:
    case CMP0088:
      bVar2 = 0xe < uVar8 || !bVar13;
      bVar18 = minorVer == 0xe;
      goto joined_r0x00196bc3;
    case CMP0089:
    case CMP0090:
      bVar2 = 0xf < uVar8 || !bVar13;
      bVar18 = minorVer == 0xf;
joined_r0x00196bc3:
      uVar9 = bVar18 && patchVer == 0xffffffff;
      uVar1 = !bVar2;
      goto joined_r0x00196bc3;
    default:
      goto switchD_00196ae7_default;
    }
    __s = idToString(id);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,__s,&local_211);
    std::operator+(&local_1e8,"CMAKE_POLICY_DEFAULT_",&local_208);
    psVar5 = cmMakefile::GetSafeDefinition(local_210,&local_1e8);
    iVar3 = std::__cxx11::string::compare((char *)psVar5);
    bVar2 = true;
    if (iVar3 == 0) {
      status = NEW;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar4 == 0) {
        status = OLD;
      }
      else {
        status = WARN;
        if (psVar5->_M_string_length != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                              local_1e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," has value \"",0xc);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"\" but must be \"OLD\", \"NEW\", or \"\" (empty).",0x2a);
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(local_210,FATAL_ERROR,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          bVar2 = false;
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p == &local_208.field_2) {
        return bVar19;
      }
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      return bVar19;
    }
    bVar2 = cmMakefile::SetPolicy(local_210,id,status);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      return bVar19;
    }
    if (id == CMP0001 && iVar3 != 0) {
      this = cmMakefile::GetState(local_210);
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CMAKE_BACKWARDS_COMPATIBILITY","");
      psVar5 = cmState::GetInitializedCacheValue(this,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
      if (psVar5 == (string *)0x0) {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CMAKE_BACKWARDS_COMPATIBILITY","");
        cmMakefile::AddCacheDefinition
                  (local_210,(string *)local_1a8,"2.4",
                   "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                   ,STRING,false);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        }
      }
    }
LAB_00196f78:
    id = id + CMP0001;
    bVar19 = id == CMPCOUNT;
    if (bVar19) {
      return bVar19;
    }
  } while( true );
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile* mf, unsigned int majorVer,
                                    unsigned int minorVer,
                                    unsigned int patchVer)
{
  // now loop over all the policies and set them as appropriate
  std::vector<cmPolicies::PolicyID> ancientPolicies;
  for (PolicyID pid = cmPolicies::CMP0000; pid != cmPolicies::CMPCOUNT;
       pid = PolicyID(pid + 1)) {
    if (isPolicyNewerThan(pid, majorVer, minorVer, patchVer)) {
      if (cmPolicies::GetPolicyStatus(pid) == cmPolicies::REQUIRED_ALWAYS) {
        ancientPolicies.push_back(pid);
      } else {
        cmPolicies::PolicyStatus status = cmPolicies::WARN;
        if (!GetPolicyDefault(mf, idToString(pid), &status) ||
            !mf->SetPolicy(pid, status)) {
          return false;
        }
        if (pid == cmPolicies::CMP0001 &&
            (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
          if (!(mf->GetState()->GetInitializedCacheValue(
                "CMAKE_BACKWARDS_COMPATIBILITY"))) {
            // Set it to 2.4 because that is the last version where the
            // variable had meaning.
            mf->AddCacheDefinition(
              "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
              "For backwards compatibility, what version of CMake "
              "commands and "
              "syntax should this version of CMake try to support.",
              cmStateEnums::STRING);
          }
        }
      }
    } else {
      if (!mf->SetPolicy(pid, cmPolicies::NEW)) {
        return false;
      }
    }
  }

  // Make sure the project does not use any ancient policies.
  if (!ancientPolicies.empty()) {
    DiagnoseAncientPolicies(ancientPolicies, majorVer, minorVer, patchVer, mf);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  return true;
}